

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<4,_4,_16777232,_true,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::TriangleMiMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  RayK<4> *pRVar1;
  undefined4 *puVar2;
  vfloat<4> vVar3;
  BVH *bvh;
  Ref<embree::Geometry> *pRVar4;
  Geometry *pGVar5;
  long lVar6;
  RTCFilterFunctionN p_Var7;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  ulong uVar15;
  ulong uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [12];
  uint uVar22;
  int iVar23;
  AABBNodeMB4D *node1;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  undefined4 uVar27;
  long lVar28;
  vuint<4> *v;
  NodeRef root;
  size_t sVar29;
  ulong uVar30;
  ulong uVar31;
  uint uVar32;
  ulong uVar33;
  long lVar34;
  NodeRef *pNVar35;
  ulong uVar36;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar37;
  bool bVar38;
  float fVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  float fVar50;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  anon_union_16_2_9473010e_for_vint_impl<4>_1 aVar47;
  float fVar48;
  float fVar49;
  undefined1 in_ZMM0 [64];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [64];
  float fVar65;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  float fVar83;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  float fVar81;
  float fVar82;
  undefined1 auVar80 [64];
  vint4 ai_2;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  float fVar95;
  float fVar105;
  float fVar106;
  vint4 ai;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  float fVar107;
  undefined1 auVar104 [16];
  float fVar108;
  float fVar121;
  float fVar122;
  vint4 ai_1;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  float fVar123;
  float fVar124;
  float fVar134;
  float fVar135;
  vint4 ai_3;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  float fVar136;
  undefined1 auVar133 [16];
  vint4 bi;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  vint4 bi_1;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [64];
  vint4 bi_3;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  float fVar161;
  float fVar166;
  float fVar167;
  vint4 bi_2;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  float fVar168;
  undefined1 auVar165 [16];
  float fVar169;
  float fVar174;
  float fVar175;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  float fVar176;
  undefined1 auVar173 [16];
  float fVar177;
  float fVar180;
  float fVar181;
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  float fVar182;
  float fVar183;
  float fVar186;
  float fVar187;
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  float fVar188;
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 in_ZMM14 [64];
  float fVar191;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  float fVar199;
  undefined1 auVar195 [16];
  float fVar197;
  float fVar198;
  undefined1 auVar196 [64];
  Precalculations pre;
  undefined1 local_1aa8 [8];
  float fStack_1aa0;
  float fStack_1a9c;
  vint<4> itime;
  Vec3<embree::vfloat_impl<4>_> p1;
  vbool<4> terminated;
  float local_19f8;
  float fStack_19f4;
  float fStack_19f0;
  Vec3<embree::vfloat_impl<4>_> p0;
  TravRayK<4,_true> tray;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1848;
  undefined1 local_1838 [16];
  undefined1 local_1828 [16];
  undefined1 local_1818 [16];
  undefined1 local_1808 [16];
  undefined1 local_17f8 [8];
  float fStack_17f0;
  float fStack_17ec;
  undefined1 local_17e8 [8];
  float fStack_17e0;
  float fStack_17dc;
  undefined8 local_16e8;
  undefined8 uStack_16e0;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  undefined1 auVar160 [64];
  
  bvh = (BVH *)This->ptr;
  stack_node[1].ptr = (bvh->root).ptr;
  if (stack_node[1].ptr != 8) {
    auVar79 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar84 = vpcmpeqd_avx(auVar79,(undefined1  [16])valid_i->field_0);
    auVar61 = ZEXT816(0) << 0x40;
    auVar9 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar61,5);
    auVar66 = auVar84 & auVar9;
    if ((((auVar66 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar66 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar66 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar66[0xf] < '\0')
    {
      auVar9 = vandps_avx(auVar9,auVar84);
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar170._8_4_ = 0x7fffffff;
      auVar170._0_8_ = 0x7fffffff7fffffff;
      auVar170._12_4_ = 0x7fffffff;
      auVar84 = vandps_avx(auVar170,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar152._8_4_ = 0x219392ef;
      auVar152._0_8_ = 0x219392ef219392ef;
      auVar152._12_4_ = 0x219392ef;
      auVar66 = vcmpps_avx(auVar84,auVar152,1);
      auVar178._8_4_ = 0x3f800000;
      auVar178._0_8_ = 0x3f8000003f800000;
      auVar178._12_4_ = 0x3f800000;
      auVar58 = vdivps_avx(auVar178,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar84 = vandps_avx(auVar170,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar96 = vcmpps_avx(auVar84,auVar152,1);
      auVar109 = vdivps_avx(auVar178,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar84 = vandps_avx(auVar170,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar84 = vcmpps_avx(auVar84,auVar152,1);
      auVar151 = ZEXT1664(auVar84);
      auVar153._8_4_ = 0x5d5e0b6b;
      auVar153._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar153._12_4_ = 0x5d5e0b6b;
      auVar160 = ZEXT1664(auVar153);
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar58,auVar153,auVar66);
      auVar66 = vdivps_avx(auVar178,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar109,auVar153,auVar96)
      ;
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar66,auVar153,auVar84);
      auVar84 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar61,1);
      auVar58._8_4_ = 0x10;
      auVar58._0_8_ = 0x1000000010;
      auVar58._12_4_ = 0x10;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar84,auVar58);
      auVar84 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar61,5);
      auVar66._8_4_ = 0x20;
      auVar66._0_8_ = 0x2000000020;
      auVar66._12_4_ = 0x20;
      auVar109._8_4_ = 0x30;
      auVar109._0_8_ = 0x3000000030;
      auVar109._12_4_ = 0x30;
      tray.nearXYZ.field_0.field_0.y.field_0 = (vint_impl<4>)vblendvps_avx(auVar109,auVar66,auVar84)
      ;
      auVar84 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar61,5);
      auVar96._8_4_ = 0x40;
      auVar96._0_8_ = 0x4000000040;
      auVar96._12_4_ = 0x40;
      auVar110._8_4_ = 0x50;
      auVar110._0_8_ = 0x5000000050;
      auVar110._12_4_ = 0x50;
      tray.nearXYZ.field_0.field_0.z.field_0 = (vint_impl<4>)vblendvps_avx(auVar110,auVar96,auVar84)
      ;
      auVar84 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar61);
      auVar66 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar61);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar196 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar84,auVar9);
      auVar64 = ZEXT1664((undefined1  [16])tray.tnear.field_0);
      auVar84._8_4_ = 0xff800000;
      auVar84._0_8_ = 0xff800000ff800000;
      auVar84._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar84,auVar66,auVar9);
      terminated.field_0.i[1] = auVar9._4_4_ ^ auVar79._4_4_;
      terminated.field_0.i[0] = auVar9._0_4_ ^ auVar79._0_4_;
      terminated.field_0.i[2] = auVar9._8_4_ ^ auVar79._8_4_;
      terminated.field_0.i[3] = auVar9._12_4_ ^ auVar79._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar32 = 3;
      }
      else {
        uVar32 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pRVar1 = ray + 0x80;
      pNVar35 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar37 = &stack_near[2].field_0;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
LAB_019c4b68:
      do {
        do {
          root.ptr = pNVar35[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_019c5bc6;
          pNVar35 = pNVar35 + -1;
          paVar37 = paVar37 + -1;
          vVar3.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar37->v;
          auVar80 = ZEXT1664((undefined1  [16])vVar3.field_0);
          auVar79 = vcmpps_avx((undefined1  [16])vVar3.field_0,(undefined1  [16])tray.tfar.field_0,1
                              );
          uVar22 = vmovmskps_avx(auVar79);
        } while (uVar22 == 0);
        uVar24 = (ulong)(uVar22 & 0xff);
        uVar22 = POPCOUNT(uVar22 & 0xff);
        if (uVar32 < uVar22) {
LAB_019c4ba8:
          do {
            uVar22 = (uint)root.ptr;
            auVar79 = auVar80._0_16_;
            if ((root.ptr & 8) != 0) {
              auVar84 = vpcmpeqd_avx(auVar64._0_16_,auVar64._0_16_);
              auVar64 = ZEXT1664(auVar84);
              if (root.ptr == 0xfffffffffffffff8) goto LAB_019c5bc6;
              auVar66 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar79,6);
              if ((((auVar66 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar66 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar66 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar66[0xf] < '\0') {
                uVar24 = (ulong)(uVar22 & 0xf);
                if (uVar24 == 8) {
                  auVar79 = vpcmpeqd_avx(auVar79,auVar79);
                  aVar62 = terminated.field_0;
                }
                else {
                  uVar26 = 0;
                  auVar79 = (undefined1  [16])terminated.field_0 ^ auVar84;
                  do {
                    lVar28 = uVar26 * 0x50 + (root.ptr & 0xfffffffffffffff0);
                    uVar27 = vmovmskps_avx(auVar79);
                    uVar15 = 0;
                    uVar25 = CONCAT44((int)(uVar26 >> 0x20),uVar27);
                    for (uVar36 = uVar25; (uVar36 & 1) == 0;
                        uVar36 = uVar36 >> 1 | 0x8000000000000000) {
                      uVar15 = uVar15 + 1;
                    }
                    uVar36 = 0;
                    auVar84 = auVar79;
                    while( true ) {
                      auVar145 = auVar151._0_16_;
                      auVar156 = auVar160._0_16_;
                      auVar189 = in_ZMM14._0_16_;
                      if (*(int *)(lVar28 + 0x40 + uVar36 * 4) == -1) break;
                      pRVar4 = (context->scene->geometries).items;
                      pGVar5 = pRVar4[*(uint *)(lVar28 + 0x30 + uVar36 * 4)].ptr;
                      fVar39 = (pGVar5->time_range).lower;
                      auVar40._4_4_ = fVar39;
                      auVar40._0_4_ = fVar39;
                      auVar40._8_4_ = fVar39;
                      auVar40._12_4_ = fVar39;
                      fVar48 = pGVar5->fnumTimeSegments;
                      auVar11 = vsubps_avx(*(undefined1 (*) [16])(ray + 0x70),auVar40);
                      fVar39 = (pGVar5->time_range).upper - fVar39;
                      auVar41._4_4_ = fVar39;
                      auVar41._0_4_ = fVar39;
                      auVar41._8_4_ = fVar39;
                      auVar41._12_4_ = fVar39;
                      auVar66 = vdivps_avx(auVar11,auVar41);
                      auVar42._0_4_ = fVar48 * auVar66._0_4_;
                      auVar42._4_4_ = fVar48 * auVar66._4_4_;
                      auVar42._8_4_ = fVar48 * auVar66._8_4_;
                      auVar42._12_4_ = fVar48 * auVar66._12_4_;
                      auVar66 = vroundps_avx(auVar42,1);
                      fVar48 = fVar48 + -1.0;
                      auVar67._4_4_ = fVar48;
                      auVar67._0_4_ = fVar48;
                      auVar67._8_4_ = fVar48;
                      auVar67._12_4_ = fVar48;
                      auVar66 = vminps_avx(auVar66,auVar67);
                      auVar66 = vmaxps_avx(auVar66,_DAT_01f7aa10);
                      auVar61 = vsubps_avx(auVar42,auVar66);
                      itime.field_0 =
                           (anon_union_16_2_9473010e_for_vint_impl<4>_1)vcvtps2dq_avx(auVar66);
                      iVar23 = itime.field_0.i[uVar15];
                      auVar68._4_4_ = iVar23;
                      auVar68._0_4_ = iVar23;
                      auVar68._8_4_ = iVar23;
                      auVar68._12_4_ = iVar23;
                      auVar10 = vpcmpeqd_avx(auVar68,(undefined1  [16])itime.field_0);
                      auVar66 = auVar79 & ~auVar10;
                      fVar39 = auVar61._0_4_;
                      fVar48 = auVar61._4_4_;
                      fVar49 = auVar61._8_4_;
                      fVar50 = auVar61._12_4_;
                      if ((((auVar66 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                           (auVar66 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar66 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          -1 < auVar66[0xf]) {
                        lVar6 = *(long *)(*(long *)&pGVar5[2].numPrimitives + (long)iVar23 * 0x38);
                        lVar34 = *(long *)(*(long *)&pGVar5[2].numPrimitives + 0x38 +
                                          (long)iVar23 * 0x38);
                        uVar30 = (ulong)*(uint *)(lVar28 + uVar36 * 4);
                        uVar33 = (ulong)*(uint *)(lVar28 + 0x10 + uVar36 * 4);
                        uVar27 = *(undefined4 *)(lVar6 + uVar30 * 4);
                        auVar115._4_4_ = uVar27;
                        auVar115._0_4_ = uVar27;
                        auVar115._8_4_ = uVar27;
                        auVar115._12_4_ = uVar27;
                        uVar27 = *(undefined4 *)(lVar6 + 4 + uVar30 * 4);
                        auVar128._4_4_ = uVar27;
                        auVar128._0_4_ = uVar27;
                        auVar128._8_4_ = uVar27;
                        auVar128._12_4_ = uVar27;
                        uVar27 = *(undefined4 *)(lVar6 + 8 + uVar30 * 4);
                        auVar139._4_4_ = uVar27;
                        auVar139._0_4_ = uVar27;
                        auVar139._8_4_ = uVar27;
                        auVar139._12_4_ = uVar27;
                        fVar65 = *(float *)(lVar34 + uVar30 * 4);
                        fVar81 = *(float *)(lVar34 + 4 + uVar30 * 4);
                        fVar82 = *(float *)(lVar34 + 8 + uVar30 * 4);
                        auVar69._8_4_ = 0x3f800000;
                        auVar69._0_8_ = 0x3f8000003f800000;
                        auVar69._12_4_ = 0x3f800000;
                        auVar66 = vsubps_avx(auVar69,auVar61);
                        auVar51._0_4_ = fVar39 * fVar65;
                        auVar51._4_4_ = fVar48 * fVar65;
                        auVar51._8_4_ = fVar49 * fVar65;
                        auVar51._12_4_ = fVar50 * fVar65;
                        auVar192._0_4_ = fVar39 * fVar81;
                        auVar192._4_4_ = fVar48 * fVar81;
                        auVar192._8_4_ = fVar49 * fVar81;
                        auVar192._12_4_ = fVar50 * fVar81;
                        auVar99._0_4_ = fVar39 * fVar82;
                        auVar99._4_4_ = fVar48 * fVar82;
                        auVar99._8_4_ = fVar49 * fVar82;
                        auVar99._12_4_ = fVar50 * fVar82;
                        _local_1aa8 = vfmadd231ps_fma(auVar51,auVar66,auVar115);
                        auVar195 = vfmadd231ps_fma(auVar192,auVar66,auVar128);
                        auVar104 = vfmadd231ps_fma(auVar99,auVar66,auVar139);
                        uVar27 = *(undefined4 *)(lVar6 + uVar33 * 4);
                        auVar146._4_4_ = uVar27;
                        auVar146._0_4_ = uVar27;
                        auVar146._8_4_ = uVar27;
                        auVar146._12_4_ = uVar27;
                        uVar27 = *(undefined4 *)(lVar6 + 4 + uVar33 * 4);
                        auVar157._4_4_ = uVar27;
                        auVar157._0_4_ = uVar27;
                        auVar157._8_4_ = uVar27;
                        auVar157._12_4_ = uVar27;
                        uVar27 = *(undefined4 *)(lVar6 + 8 + uVar33 * 4);
                        auVar162._4_4_ = uVar27;
                        auVar162._0_4_ = uVar27;
                        auVar162._8_4_ = uVar27;
                        auVar162._12_4_ = uVar27;
                        fVar65 = *(float *)(lVar34 + uVar33 * 4);
                        fVar81 = *(float *)(lVar34 + 4 + uVar33 * 4);
                        fVar82 = *(float *)(lVar34 + 8 + uVar33 * 4);
                        auVar52._0_4_ = fVar39 * fVar65;
                        auVar52._4_4_ = fVar48 * fVar65;
                        auVar52._8_4_ = fVar49 * fVar65;
                        auVar52._12_4_ = fVar50 * fVar65;
                        auVar129._0_4_ = fVar39 * fVar81;
                        auVar129._4_4_ = fVar48 * fVar81;
                        auVar129._8_4_ = fVar49 * fVar81;
                        auVar129._12_4_ = fVar50 * fVar81;
                        auVar91._0_4_ = fVar39 * fVar82;
                        auVar91._4_4_ = fVar48 * fVar82;
                        auVar91._8_4_ = fVar49 * fVar82;
                        auVar91._12_4_ = fVar50 * fVar82;
                        auVar60 = vfmadd231ps_fma(auVar52,auVar66,auVar146);
                        auVar133 = vfmadd231ps_fma(auVar129,auVar66,auVar157);
                        auVar94 = vfmadd231ps_fma(auVar91,auVar66,auVar162);
                        uVar30 = (ulong)*(uint *)(lVar28 + 0x20 + uVar36 * 4);
                        uVar27 = *(undefined4 *)(lVar6 + uVar30 * 4);
                        auVar158._4_4_ = uVar27;
                        auVar158._0_4_ = uVar27;
                        auVar158._8_4_ = uVar27;
                        auVar158._12_4_ = uVar27;
                        uVar27 = *(undefined4 *)(lVar6 + 4 + uVar30 * 4);
                        auVar179._4_4_ = uVar27;
                        auVar179._0_4_ = uVar27;
                        auVar179._8_4_ = uVar27;
                        auVar179._12_4_ = uVar27;
                        uVar27 = *(undefined4 *)(lVar6 + 8 + uVar30 * 4);
                        auVar184._4_4_ = uVar27;
                        auVar184._0_4_ = uVar27;
                        auVar184._8_4_ = uVar27;
                        auVar184._12_4_ = uVar27;
                        fVar65 = *(float *)(lVar34 + uVar30 * 4);
                        fVar81 = *(float *)(lVar34 + 4 + uVar30 * 4);
                        fVar82 = *(float *)(lVar34 + 8 + uVar30 * 4);
                        auVar147._0_4_ = fVar65 * fVar39;
                        auVar147._4_4_ = fVar65 * fVar48;
                        auVar147._8_4_ = fVar65 * fVar49;
                        auVar147._12_4_ = fVar65 * fVar50;
                        auVar163._0_4_ = fVar81 * fVar39;
                        auVar163._4_4_ = fVar81 * fVar48;
                        auVar163._8_4_ = fVar81 * fVar49;
                        auVar163._12_4_ = fVar81 * fVar50;
                        auVar171._0_4_ = fVar82 * fVar39;
                        auVar171._4_4_ = fVar82 * fVar48;
                        auVar171._8_4_ = fVar82 * fVar49;
                        auVar171._12_4_ = fVar82 * fVar50;
                        auVar150 = vfmadd231ps_fma(auVar147,auVar66,auVar158);
                        auVar165 = vfmadd231ps_fma(auVar163,auVar66,auVar179);
                        auVar173 = vfmadd231ps_fma(auVar171,auVar66,auVar184);
                      }
                      else {
                        if (uVar25 != 0) {
                          lVar6 = *(long *)&pGVar5[2].numPrimitives;
                          uVar31 = (ulong)*(uint *)(lVar28 + uVar36 * 4);
                          uVar33 = uVar25;
                          uVar30 = uVar15;
                          do {
                            lVar34 = (long)itime.field_0.i[uVar30] * 0x38;
                            auVar66 = *(undefined1 (*) [16])(*(long *)(lVar6 + lVar34) + uVar31 * 4)
                            ;
                            puVar2 = (undefined4 *)(*(long *)(lVar6 + 0x38 + lVar34) + uVar31 * 4);
                            uVar17 = *puVar2;
                            uVar18 = puVar2[1];
                            uVar19 = puVar2[2];
                            *(int *)((long)&p0.field_0 + uVar30 * 4) = auVar66._0_4_;
                            uVar27 = vextractps_avx(auVar66,1);
                            *(undefined4 *)((long)&p0.field_0 + uVar30 * 4 + 0x10) = uVar27;
                            uVar27 = vextractps_avx(auVar66,2);
                            *(undefined4 *)((long)&p0.field_0 + uVar30 * 4 + 0x20) = uVar27;
                            *(undefined4 *)((long)&p1.field_0 + uVar30 * 4) = uVar17;
                            *(undefined4 *)((long)&p1.field_0 + uVar30 * 4 + 0x10) = uVar18;
                            *(undefined4 *)((long)&p1.field_0 + uVar30 * 4 + 0x20) = uVar19;
                            uVar33 = uVar33 ^ 1L << (uVar30 & 0x3f);
                            uVar30 = 0;
                            for (uVar16 = uVar33; (uVar16 & 1) == 0;
                                uVar16 = uVar16 >> 1 | 0x8000000000000000) {
                              uVar30 = uVar30 + 1;
                            }
                          } while (uVar33 != 0);
                          auVar11._8_8_ = p0.field_0._8_8_;
                          auVar11._0_8_ = p0.field_0._0_8_;
                          auVar10._8_8_ = p1.field_0._8_8_;
                          auVar10._0_8_ = p1.field_0._0_8_;
                        }
                        auVar77._8_4_ = 0x3f800000;
                        auVar77._0_8_ = 0x3f8000003f800000;
                        auVar77._12_4_ = 0x3f800000;
                        auVar66 = vsubps_avx(auVar77,auVar61);
                        fVar65 = auVar66._0_4_;
                        fVar191 = fVar65 * (float)p0.field_0._16_4_;
                        fVar81 = auVar66._4_4_;
                        fVar197 = fVar81 * (float)p0.field_0._20_4_;
                        fVar82 = auVar66._8_4_;
                        fVar198 = fVar82 * (float)p0.field_0._24_4_;
                        fVar83 = auVar66._12_4_;
                        fVar199 = fVar83 * (float)p0.field_0._28_4_;
                        fVar108 = fVar65 * (float)p0.field_0._32_4_;
                        fVar121 = fVar81 * (float)p0.field_0._36_4_;
                        fVar122 = fVar82 * (float)p0.field_0._40_4_;
                        fVar123 = fVar83 * (float)p0.field_0._44_4_;
                        fVar124 = fVar39 * (float)p1.field_0._16_4_;
                        fVar134 = fVar48 * (float)p1.field_0._20_4_;
                        fVar135 = fVar49 * (float)p1.field_0._24_4_;
                        fVar136 = fVar50 * (float)p1.field_0._28_4_;
                        fVar95 = fVar39 * (float)p1.field_0._32_4_;
                        fVar105 = fVar48 * (float)p1.field_0._36_4_;
                        fVar106 = fVar49 * (float)p1.field_0._40_4_;
                        fVar107 = fVar50 * (float)p1.field_0._44_4_;
                        if (uVar25 != 0) {
                          lVar6 = *(long *)&pGVar5[2].numPrimitives;
                          uVar31 = (ulong)*(uint *)(lVar28 + 0x10 + uVar36 * 4);
                          uVar33 = uVar25;
                          uVar30 = uVar15;
                          do {
                            lVar34 = (long)itime.field_0.i[uVar30] * 0x38;
                            auVar66 = *(undefined1 (*) [16])(*(long *)(lVar6 + lVar34) + uVar31 * 4)
                            ;
                            auVar61 = *(undefined1 (*) [16])
                                       (*(long *)(lVar6 + 0x38 + lVar34) + uVar31 * 4);
                            *(int *)((long)&p0.field_0 + uVar30 * 4) = auVar66._0_4_;
                            uVar27 = vextractps_avx(auVar66,1);
                            *(undefined4 *)((long)&p0.field_0 + uVar30 * 4 + 0x10) = uVar27;
                            uVar27 = vextractps_avx(auVar66,2);
                            *(undefined4 *)((long)&p0.field_0 + uVar30 * 4 + 0x20) = uVar27;
                            *(int *)((long)&p1.field_0 + uVar30 * 4) = auVar61._0_4_;
                            uVar27 = vextractps_avx(auVar61,1);
                            *(undefined4 *)((long)&p1.field_0 + uVar30 * 4 + 0x10) = uVar27;
                            uVar27 = vextractps_avx(auVar61,2);
                            *(undefined4 *)((long)&p1.field_0 + uVar30 * 4 + 0x20) = uVar27;
                            uVar33 = uVar33 ^ 1L << (uVar30 & 0x3f);
                            uVar30 = 0;
                            for (uVar16 = uVar33; (uVar16 & 1) == 0;
                                uVar16 = uVar16 >> 1 | 0x8000000000000000) {
                              uVar30 = uVar30 + 1;
                            }
                          } while (uVar33 != 0);
                          auVar145._8_8_ = p0.field_0._8_8_;
                          auVar145._0_8_ = p0.field_0._0_8_;
                          auVar156._8_8_ = p1.field_0._8_8_;
                          auVar156._0_8_ = p1.field_0._0_8_;
                        }
                        fVar161 = fVar65 * (float)p0.field_0._16_4_;
                        fVar166 = fVar81 * (float)p0.field_0._20_4_;
                        fVar167 = fVar82 * (float)p0.field_0._24_4_;
                        fVar168 = fVar83 * (float)p0.field_0._28_4_;
                        fVar169 = fVar65 * (float)p0.field_0._32_4_;
                        fVar174 = fVar81 * (float)p0.field_0._36_4_;
                        fVar175 = fVar82 * (float)p0.field_0._40_4_;
                        fVar176 = fVar83 * (float)p0.field_0._44_4_;
                        fVar177 = fVar39 * (float)p1.field_0._16_4_;
                        fVar180 = fVar48 * (float)p1.field_0._20_4_;
                        fVar181 = fVar49 * (float)p1.field_0._24_4_;
                        fVar182 = fVar50 * (float)p1.field_0._28_4_;
                        fVar183 = fVar39 * (float)p1.field_0._32_4_;
                        fVar186 = fVar48 * (float)p1.field_0._36_4_;
                        fVar187 = fVar49 * (float)p1.field_0._40_4_;
                        fVar188 = fVar50 * (float)p1.field_0._44_4_;
                        auVar142 = auVar84;
                        if (uVar25 != 0) {
                          lVar6 = *(long *)&pGVar5[2].numPrimitives;
                          uVar31 = (ulong)*(uint *)(lVar28 + 0x20 + uVar36 * 4);
                          uVar33 = uVar25;
                          uVar30 = uVar15;
                          do {
                            lVar34 = (long)itime.field_0.i[uVar30] * 0x38;
                            auVar66 = *(undefined1 (*) [16])(*(long *)(lVar6 + lVar34) + uVar31 * 4)
                            ;
                            auVar61 = *(undefined1 (*) [16])
                                       (*(long *)(lVar6 + 0x38 + lVar34) + uVar31 * 4);
                            *(int *)((long)&p0.field_0 + uVar30 * 4) = auVar66._0_4_;
                            uVar27 = vextractps_avx(auVar66,1);
                            *(undefined4 *)((long)&p0.field_0 + uVar30 * 4 + 0x10) = uVar27;
                            uVar27 = vextractps_avx(auVar66,2);
                            *(undefined4 *)((long)&p0.field_0 + uVar30 * 4 + 0x20) = uVar27;
                            *(int *)((long)&p1.field_0 + uVar30 * 4) = auVar61._0_4_;
                            uVar27 = vextractps_avx(auVar61,1);
                            *(undefined4 *)((long)&p1.field_0 + uVar30 * 4 + 0x10) = uVar27;
                            uVar27 = vextractps_avx(auVar61,2);
                            *(undefined4 *)((long)&p1.field_0 + uVar30 * 4 + 0x20) = uVar27;
                            uVar33 = uVar33 ^ 1L << (uVar30 & 0x3f);
                            uVar30 = 0;
                            for (uVar16 = uVar33; (uVar16 & 1) == 0;
                                uVar16 = uVar16 >> 1 | 0x8000000000000000) {
                              uVar30 = uVar30 + 1;
                            }
                          } while (uVar33 != 0);
                          auVar142._8_8_ = p0.field_0._8_8_;
                          auVar142._0_8_ = p0.field_0._0_8_;
                          auVar189._8_8_ = p1.field_0._8_8_;
                          auVar189._0_8_ = p1.field_0._0_8_;
                        }
                        local_1aa8._4_4_ = fVar81 * auVar11._4_4_ + fVar48 * auVar10._4_4_;
                        local_1aa8._0_4_ = fVar65 * auVar11._0_4_ + fVar39 * auVar10._0_4_;
                        fStack_1aa0 = fVar82 * auVar11._8_4_ + fVar49 * auVar10._8_4_;
                        fStack_1a9c = fVar83 * auVar11._12_4_ + fVar50 * auVar10._12_4_;
                        auVar195._0_4_ = fVar191 + fVar124;
                        auVar195._4_4_ = fVar197 + fVar134;
                        auVar195._8_4_ = fVar198 + fVar135;
                        auVar195._12_4_ = fVar199 + fVar136;
                        auVar104._0_4_ = fVar108 + fVar95;
                        auVar104._4_4_ = fVar121 + fVar105;
                        auVar104._8_4_ = fVar122 + fVar106;
                        auVar104._12_4_ = fVar123 + fVar107;
                        auVar60._0_4_ = auVar145._0_4_ * fVar65 + auVar156._0_4_ * fVar39;
                        auVar60._4_4_ = auVar145._4_4_ * fVar81 + auVar156._4_4_ * fVar48;
                        auVar60._8_4_ = auVar145._8_4_ * fVar82 + auVar156._8_4_ * fVar49;
                        auVar60._12_4_ = auVar145._12_4_ * fVar83 + auVar156._12_4_ * fVar50;
                        auVar133._0_4_ = fVar161 + fVar177;
                        auVar133._4_4_ = fVar166 + fVar180;
                        auVar133._8_4_ = fVar167 + fVar181;
                        auVar133._12_4_ = fVar168 + fVar182;
                        auVar94._0_4_ = fVar169 + fVar183;
                        auVar94._4_4_ = fVar174 + fVar186;
                        auVar94._8_4_ = fVar175 + fVar187;
                        auVar94._12_4_ = fVar176 + fVar188;
                        auVar150._0_4_ = fVar65 * auVar142._0_4_ + auVar189._0_4_ * fVar39;
                        auVar150._4_4_ = fVar81 * auVar142._4_4_ + auVar189._4_4_ * fVar48;
                        auVar150._8_4_ = fVar82 * auVar142._8_4_ + auVar189._8_4_ * fVar49;
                        auVar150._12_4_ = fVar83 * auVar142._12_4_ + auVar189._12_4_ * fVar50;
                        auVar165._0_4_ =
                             fVar65 * (float)p0.field_0._16_4_ + fVar39 * (float)p1.field_0._16_4_;
                        auVar165._4_4_ =
                             fVar81 * (float)p0.field_0._20_4_ + fVar48 * (float)p1.field_0._20_4_;
                        auVar165._8_4_ =
                             fVar82 * (float)p0.field_0._24_4_ + fVar49 * (float)p1.field_0._24_4_;
                        auVar165._12_4_ =
                             fVar83 * (float)p0.field_0._28_4_ + fVar50 * (float)p1.field_0._28_4_;
                        auVar173._0_4_ =
                             fVar65 * (float)p0.field_0._32_4_ + fVar39 * (float)p1.field_0._32_4_;
                        auVar173._4_4_ =
                             fVar81 * (float)p0.field_0._36_4_ + fVar48 * (float)p1.field_0._36_4_;
                        auVar173._8_4_ =
                             fVar82 * (float)p0.field_0._40_4_ + fVar49 * (float)p1.field_0._40_4_;
                        auVar173._12_4_ =
                             fVar83 * (float)p0.field_0._44_4_ + fVar50 * (float)p1.field_0._44_4_;
                      }
                      local_16e8 = *(undefined8 *)(lVar28 + 0x30);
                      uStack_16e0 = *(undefined8 *)(lVar28 + 0x38);
                      auVar66 = *(undefined1 (*) [16])ray;
                      auVar61 = *(undefined1 (*) [16])(ray + 0x10);
                      auVar96 = *(undefined1 (*) [16])(ray + 0x20);
                      auVar58 = vsubps_avx(_local_1aa8,auVar66);
                      auVar109 = vsubps_avx(auVar195,auVar61);
                      auVar110 = vsubps_avx(auVar104,auVar96);
                      auVar152 = vsubps_avx(auVar60,auVar66);
                      auVar153 = vsubps_avx(auVar133,auVar61);
                      auVar178 = vsubps_avx(auVar94,auVar96);
                      auVar12 = vsubps_avx(auVar150,auVar66);
                      auVar61 = vsubps_avx(auVar165,auVar61);
                      auVar96 = vsubps_avx(auVar173,auVar96);
                      auVar13 = vsubps_avx(auVar12,auVar58);
                      auVar14 = vsubps_avx(auVar61,auVar109);
                      auVar85 = vsubps_avx(auVar96,auVar110);
                      auVar92._0_4_ = auVar12._0_4_ + auVar58._0_4_;
                      auVar92._4_4_ = auVar12._4_4_ + auVar58._4_4_;
                      auVar92._8_4_ = auVar12._8_4_ + auVar58._8_4_;
                      auVar92._12_4_ = auVar12._12_4_ + auVar58._12_4_;
                      auVar130._0_4_ = auVar61._0_4_ + auVar109._0_4_;
                      auVar130._4_4_ = auVar61._4_4_ + auVar109._4_4_;
                      auVar130._8_4_ = auVar61._8_4_ + auVar109._8_4_;
                      auVar130._12_4_ = auVar61._12_4_ + auVar109._12_4_;
                      fVar124 = auVar110._0_4_;
                      auVar148._0_4_ = fVar124 + auVar96._0_4_;
                      fVar134 = auVar110._4_4_;
                      auVar148._4_4_ = fVar134 + auVar96._4_4_;
                      fVar135 = auVar110._8_4_;
                      auVar148._8_4_ = fVar135 + auVar96._8_4_;
                      fVar136 = auVar110._12_4_;
                      auVar148._12_4_ = fVar136 + auVar96._12_4_;
                      auVar172._0_4_ = auVar85._0_4_ * auVar130._0_4_;
                      auVar172._4_4_ = auVar85._4_4_ * auVar130._4_4_;
                      auVar172._8_4_ = auVar85._8_4_ * auVar130._8_4_;
                      auVar172._12_4_ = auVar85._12_4_ * auVar130._12_4_;
                      auVar87 = vfmsub231ps_fma(auVar172,auVar14,auVar148);
                      auVar164._0_4_ = auVar148._0_4_ * auVar13._0_4_;
                      auVar164._4_4_ = auVar148._4_4_ * auVar13._4_4_;
                      auVar164._8_4_ = auVar148._8_4_ * auVar13._8_4_;
                      auVar164._12_4_ = auVar148._12_4_ * auVar13._12_4_;
                      auVar86 = vfmsub231ps_fma(auVar164,auVar85,auVar92);
                      auVar93._0_4_ = auVar92._0_4_ * auVar14._0_4_;
                      auVar93._4_4_ = auVar92._4_4_ * auVar14._4_4_;
                      auVar93._8_4_ = auVar92._8_4_ * auVar14._8_4_;
                      auVar93._12_4_ = auVar92._12_4_ * auVar14._12_4_;
                      auVar66 = vfmsub231ps_fma(auVar93,auVar13,auVar130);
                      fVar108 = *(float *)(ray + 0x60);
                      fVar121 = *(float *)(ray + 100);
                      fVar122 = *(float *)(ray + 0x68);
                      auVar21 = *(undefined1 (*) [12])(ray + 0x60);
                      fVar123 = *(float *)(ray + 0x6c);
                      auVar185._0_4_ = fVar108 * auVar66._0_4_;
                      auVar185._4_4_ = fVar121 * auVar66._4_4_;
                      auVar185._8_4_ = fVar122 * auVar66._8_4_;
                      auVar185._12_4_ = fVar123 * auVar66._12_4_;
                      auVar66 = *(undefined1 (*) [16])(ray + 0x50);
                      auVar86 = vfmadd231ps_fma(auVar185,auVar66,auVar86);
                      auVar149 = *(undefined1 (*) [16])(ray + 0x40);
                      auVar89 = vfmadd231ps_fma(auVar86,auVar149,auVar87);
                      auVar86 = vsubps_avx(auVar109,auVar153);
                      auVar110 = vsubps_avx(auVar110,auVar178);
                      auVar131._0_4_ = auVar153._0_4_ + auVar109._0_4_;
                      auVar131._4_4_ = auVar153._4_4_ + auVar109._4_4_;
                      auVar131._8_4_ = auVar153._8_4_ + auVar109._8_4_;
                      auVar131._12_4_ = auVar153._12_4_ + auVar109._12_4_;
                      auVar193._0_4_ = fVar124 + auVar178._0_4_;
                      auVar193._4_4_ = fVar134 + auVar178._4_4_;
                      auVar193._8_4_ = fVar135 + auVar178._8_4_;
                      auVar193._12_4_ = fVar136 + auVar178._12_4_;
                      fVar39 = auVar110._0_4_;
                      auVar116._0_4_ = auVar131._0_4_ * fVar39;
                      fVar50 = auVar110._4_4_;
                      auVar116._4_4_ = auVar131._4_4_ * fVar50;
                      fVar82 = auVar110._8_4_;
                      auVar116._8_4_ = auVar131._8_4_ * fVar82;
                      fVar105 = auVar110._12_4_;
                      auVar116._12_4_ = auVar131._12_4_ * fVar105;
                      auVar90 = vfmsub231ps_fma(auVar116,auVar86,auVar193);
                      auVar87 = vsubps_avx(auVar58,auVar152);
                      fVar48 = auVar87._0_4_;
                      auVar194._0_4_ = auVar193._0_4_ * fVar48;
                      fVar65 = auVar87._4_4_;
                      auVar194._4_4_ = auVar193._4_4_ * fVar65;
                      fVar83 = auVar87._8_4_;
                      auVar194._8_4_ = auVar193._8_4_ * fVar83;
                      fVar106 = auVar87._12_4_;
                      auVar194._12_4_ = auVar193._12_4_ * fVar106;
                      auVar140._0_4_ = auVar152._0_4_ + auVar58._0_4_;
                      auVar140._4_4_ = auVar152._4_4_ + auVar58._4_4_;
                      auVar140._8_4_ = auVar152._8_4_ + auVar58._8_4_;
                      auVar140._12_4_ = auVar152._12_4_ + auVar58._12_4_;
                      auVar88 = vfmsub231ps_fma(auVar194,auVar110,auVar140);
                      fVar49 = auVar86._0_4_;
                      auVar141._0_4_ = auVar140._0_4_ * fVar49;
                      fVar81 = auVar86._4_4_;
                      auVar141._4_4_ = auVar140._4_4_ * fVar81;
                      fVar95 = auVar86._8_4_;
                      auVar141._8_4_ = auVar140._8_4_ * fVar95;
                      fVar107 = auVar86._12_4_;
                      auVar141._12_4_ = auVar140._12_4_ * fVar107;
                      auVar97 = vfmsub231ps_fma(auVar141,auVar87,auVar131);
                      auVar132._0_4_ = fVar108 * auVar97._0_4_;
                      auVar132._4_4_ = fVar121 * auVar97._4_4_;
                      auVar132._8_4_ = fVar122 * auVar97._8_4_;
                      auVar132._12_4_ = fVar123 * auVar97._12_4_;
                      auVar88 = vfmadd231ps_fma(auVar132,auVar66,auVar88);
                      auVar90 = vfmadd231ps_fma(auVar88,auVar149,auVar90);
                      auVar88 = vsubps_avx(auVar152,auVar12);
                      auVar53._0_4_ = auVar152._0_4_ + auVar12._0_4_;
                      auVar53._4_4_ = auVar152._4_4_ + auVar12._4_4_;
                      auVar53._8_4_ = auVar152._8_4_ + auVar12._8_4_;
                      auVar53._12_4_ = auVar152._12_4_ + auVar12._12_4_;
                      auVar152 = vsubps_avx(auVar153,auVar61);
                      auVar43._0_4_ = auVar153._0_4_ + auVar61._0_4_;
                      auVar43._4_4_ = auVar153._4_4_ + auVar61._4_4_;
                      auVar43._8_4_ = auVar153._8_4_ + auVar61._8_4_;
                      auVar43._12_4_ = auVar153._12_4_ + auVar61._12_4_;
                      auVar159 = vsubps_avx(auVar178,auVar96);
                      auVar70._0_4_ = auVar178._0_4_ + auVar96._0_4_;
                      auVar70._4_4_ = auVar178._4_4_ + auVar96._4_4_;
                      auVar70._8_4_ = auVar178._8_4_ + auVar96._8_4_;
                      auVar70._12_4_ = auVar178._12_4_ + auVar96._12_4_;
                      auVar100._0_4_ = auVar159._0_4_ * auVar43._0_4_;
                      auVar100._4_4_ = auVar159._4_4_ * auVar43._4_4_;
                      auVar100._8_4_ = auVar159._8_4_ * auVar43._8_4_;
                      auVar100._12_4_ = auVar159._12_4_ * auVar43._12_4_;
                      auVar96 = vfmsub231ps_fma(auVar100,auVar152,auVar70);
                      auVar71._0_4_ = auVar88._0_4_ * auVar70._0_4_;
                      auVar71._4_4_ = auVar88._4_4_ * auVar70._4_4_;
                      auVar71._8_4_ = auVar88._8_4_ * auVar70._8_4_;
                      auVar71._12_4_ = auVar88._12_4_ * auVar70._12_4_;
                      auVar61 = vfmsub231ps_fma(auVar71,auVar159,auVar53);
                      auVar54._0_4_ = auVar152._0_4_ * auVar53._0_4_;
                      auVar54._4_4_ = auVar152._4_4_ * auVar53._4_4_;
                      auVar54._8_4_ = auVar152._8_4_ * auVar53._8_4_;
                      auVar54._12_4_ = auVar152._12_4_ * auVar53._12_4_;
                      auVar153 = vfmsub231ps_fma(auVar54,auVar88,auVar43);
                      auVar44._0_4_ = fVar108 * auVar153._0_4_;
                      auVar44._4_4_ = fVar121 * auVar153._4_4_;
                      auVar44._8_4_ = fVar122 * auVar153._8_4_;
                      auVar44._12_4_ = fVar123 * auVar153._12_4_;
                      auVar61 = vfmadd231ps_fma(auVar44,auVar66,auVar61);
                      auVar153 = vfmadd231ps_fma(auVar61,auVar149,auVar96);
                      auVar117._0_4_ = auVar153._0_4_ + auVar89._0_4_ + auVar90._0_4_;
                      auVar117._4_4_ = auVar153._4_4_ + auVar89._4_4_ + auVar90._4_4_;
                      auVar117._8_4_ = auVar153._8_4_ + auVar89._8_4_ + auVar90._8_4_;
                      auVar117._12_4_ = auVar153._12_4_ + auVar89._12_4_ + auVar90._12_4_;
                      auVar61 = vandps_avx(auVar170,auVar117);
                      auVar55._0_4_ = auVar61._0_4_ * 1.1920929e-07;
                      auVar55._4_4_ = auVar61._4_4_ * 1.1920929e-07;
                      auVar55._8_4_ = auVar61._8_4_ * 1.1920929e-07;
                      auVar55._12_4_ = auVar61._12_4_ * 1.1920929e-07;
                      auVar61 = vminps_avx(auVar89,auVar90);
                      auVar61 = vminps_avx(auVar61,auVar153);
                      auVar190._8_4_ = 0x80000000;
                      auVar190._0_8_ = 0x8000000080000000;
                      auVar190._12_4_ = 0x80000000;
                      uVar30 = CONCAT44(auVar55._4_4_,auVar55._0_4_);
                      auVar101._0_8_ = uVar30 ^ 0x8000000080000000;
                      auVar101._8_4_ = -auVar55._8_4_;
                      auVar101._12_4_ = -auVar55._12_4_;
                      auVar96 = vcmpps_avx(auVar61,auVar101,5);
                      auVar61 = vmaxps_avx(auVar89,auVar90);
                      auVar61 = vmaxps_avx(auVar61,auVar153);
                      auVar61 = vcmpps_avx(auVar61,auVar55,2);
                      auVar61 = vorps_avx(auVar96,auVar61);
                      auVar153 = auVar84 & auVar61;
                      auVar61 = vandps_avx(auVar61,auVar84);
                      if ((((auVar153 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar153 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar153 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          auVar153[0xf] < '\0') {
                        auVar45._0_4_ = fVar49 * auVar85._0_4_;
                        auVar45._4_4_ = fVar81 * auVar85._4_4_;
                        auVar45._8_4_ = fVar95 * auVar85._8_4_;
                        auVar45._12_4_ = fVar107 * auVar85._12_4_;
                        auVar178 = vfmsub213ps_fma(auVar14,auVar110,auVar45);
                        auVar72._0_4_ = auVar152._0_4_ * fVar39;
                        auVar72._4_4_ = auVar152._4_4_ * fVar50;
                        auVar72._8_4_ = auVar152._8_4_ * fVar82;
                        auVar72._12_4_ = auVar152._12_4_ * fVar105;
                        auVar102._0_4_ = auVar159._0_4_ * fVar48;
                        auVar102._4_4_ = auVar159._4_4_ * fVar65;
                        auVar102._8_4_ = auVar159._8_4_ * fVar83;
                        auVar102._12_4_ = auVar159._12_4_ * fVar106;
                        auVar12 = vfmsub213ps_fma(auVar159,auVar86,auVar72);
                        auVar96 = vandps_avx(auVar170,auVar45);
                        auVar153 = vandps_avx(auVar170,auVar72);
                        auVar96 = vcmpps_avx(auVar96,auVar153,1);
                        auVar153 = vblendvps_avx(auVar12,auVar178,auVar96);
                        auVar118._0_4_ = auVar88._0_4_ * fVar49;
                        auVar118._4_4_ = auVar88._4_4_ * fVar81;
                        auVar118._8_4_ = auVar88._8_4_ * fVar95;
                        auVar118._12_4_ = auVar88._12_4_ * fVar107;
                        auVar178 = vfmsub213ps_fma(auVar88,auVar110,auVar102);
                        auVar73._0_4_ = fVar39 * auVar13._0_4_;
                        auVar73._4_4_ = fVar50 * auVar13._4_4_;
                        auVar73._8_4_ = fVar82 * auVar13._8_4_;
                        auVar73._12_4_ = fVar105 * auVar13._12_4_;
                        auVar12 = vfmsub213ps_fma(auVar85,auVar87,auVar73);
                        auVar96 = vandps_avx(auVar170,auVar73);
                        auVar110 = vandps_avx(auVar170,auVar102);
                        auVar96 = vcmpps_avx(auVar96,auVar110,1);
                        auVar96 = vblendvps_avx(auVar178,auVar12,auVar96);
                        auVar20._4_4_ = fVar65 * auVar14._4_4_;
                        auVar20._0_4_ = fVar48 * auVar14._0_4_;
                        auVar20._8_4_ = fVar83 * auVar14._8_4_;
                        auVar20._12_4_ = fVar106 * auVar14._12_4_;
                        auVar178 = vfmsub213ps_fma(auVar13,auVar86,auVar20);
                        auVar12 = vfmsub213ps_fma(auVar152,auVar87,auVar118);
                        auVar110 = vandps_avx(auVar170,auVar20);
                        auVar152 = vandps_avx(auVar170,auVar118);
                        auVar110 = vcmpps_avx(auVar110,auVar152,1);
                        aVar8 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                                vblendvps_avx(auVar12,auVar178,auVar110);
                        local_19f8 = auVar21._0_4_;
                        fStack_19f4 = auVar21._4_4_;
                        fStack_19f0 = auVar21._8_4_;
                        auVar56._0_4_ = aVar8.v[0] * local_19f8;
                        auVar56._4_4_ = aVar8.v[1] * fStack_19f4;
                        auVar56._8_4_ = aVar8.v[2] * fStack_19f0;
                        auVar56._12_4_ = aVar8.v[3] * fVar123;
                        auVar66 = vfmadd213ps_fma(auVar66,auVar96,auVar56);
                        auVar66 = vfmadd213ps_fma(auVar149,auVar153,auVar66);
                        auVar57._0_4_ = auVar66._0_4_ + auVar66._0_4_;
                        auVar57._4_4_ = auVar66._4_4_ + auVar66._4_4_;
                        auVar57._8_4_ = auVar66._8_4_ + auVar66._8_4_;
                        auVar57._12_4_ = auVar66._12_4_ + auVar66._12_4_;
                        auVar119._0_4_ = aVar8.v[0] * fVar124;
                        auVar119._4_4_ = aVar8.v[1] * fVar134;
                        auVar119._8_4_ = aVar8.v[2] * fVar135;
                        auVar119._12_4_ = aVar8.v[3] * fVar136;
                        auVar66 = vfmadd213ps_fma(auVar109,auVar96,auVar119);
                        auVar58 = vfmadd213ps_fma(auVar58,auVar153,auVar66);
                        auVar66 = vrcpps_avx(auVar57);
                        auVar159._8_4_ = 0x3f800000;
                        auVar159._0_8_ = 0x3f8000003f800000;
                        auVar159._12_4_ = 0x3f800000;
                        auVar109 = vfnmadd213ps_fma(auVar66,auVar57,auVar159);
                        auVar66 = vfmadd132ps_fma(auVar109,auVar66,auVar66);
                        auVar120._0_4_ = auVar66._0_4_ * (auVar58._0_4_ + auVar58._0_4_);
                        auVar120._4_4_ = auVar66._4_4_ * (auVar58._4_4_ + auVar58._4_4_);
                        auVar120._8_4_ = auVar66._8_4_ * (auVar58._8_4_ + auVar58._8_4_);
                        auVar120._12_4_ = auVar66._12_4_ * (auVar58._12_4_ + auVar58._12_4_);
                        auVar66 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar120,2);
                        auVar58 = vcmpps_avx(auVar120,*(undefined1 (*) [16])(ray + 0x80),2);
                        auVar66 = vandps_avx(auVar58,auVar66);
                        uVar30 = CONCAT44(auVar57._4_4_,auVar57._0_4_);
                        auVar149._0_8_ = uVar30 ^ 0x8000000080000000;
                        auVar149._8_4_ = -auVar57._8_4_;
                        auVar149._12_4_ = -auVar57._12_4_;
                        auVar58 = vcmpps_avx(auVar149,auVar57,4);
                        auVar66 = vandps_avx(auVar58,auVar66);
                        auVar66 = vpslld_avx(auVar66,0x1f);
                        auVar58 = vpsrad_avx(auVar66,0x1f);
                        auVar66 = auVar61 & auVar58;
                        auVar61 = vandps_avx(auVar58,auVar61);
                        auVar190 = auVar86;
                        if ((((auVar66 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                             (auVar66 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar66 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            auVar66[0xf] < '\0') {
                          local_1848 = aVar8;
                          local_1838 = auVar96;
                          local_1828 = auVar153;
                          local_1818 = auVar120;
                          local_1808 = auVar117;
                          _local_17f8 = auVar90;
                          _local_17e8 = auVar89;
                        }
                      }
                      auVar196 = ZEXT1664(CONCAT412(0x7f800000,
                                                    CONCAT48(0x7f800000,0x7f8000007f800000)));
                      in_ZMM14 = ZEXT1664(auVar190);
                      auVar160 = ZEXT1664(auVar159);
                      auVar151 = ZEXT1664(auVar149);
                      auVar80 = ZEXT1664(auVar96);
                      pGVar5 = pRVar4[*(uint *)((long)&local_16e8 + uVar36 * 4)].ptr;
                      uVar22 = pGVar5->mask;
                      auVar46._4_4_ = uVar22;
                      auVar46._0_4_ = uVar22;
                      auVar46._8_4_ = uVar22;
                      auVar46._12_4_ = uVar22;
                      auVar66 = vpand_avx(auVar46,*(undefined1 (*) [16])(ray + 0x90));
                      auVar66 = vpcmpeqd_avx(auVar66,_DAT_01f7aa10);
                      auVar96 = auVar61 & ~auVar66;
                      if ((((auVar96 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar96 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar96 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          auVar96[0xf] < '\0') {
                        aVar47 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                                 vandnps_avx(auVar66,auVar61);
                        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                           (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                          auVar66 = vandps_avx(auVar170,local_1808);
                          auVar61 = vrcpps_avx(local_1808);
                          auVar103._8_4_ = 0x3f800000;
                          auVar103._0_8_ = 0x3f8000003f800000;
                          auVar103._12_4_ = 0x3f800000;
                          auVar96 = vfnmadd213ps_fma(auVar61,local_1808,auVar103);
                          auVar61 = vfmadd132ps_fma(auVar96,auVar61,auVar61);
                          auVar74._8_4_ = 0x219392ef;
                          auVar74._0_8_ = 0x219392ef219392ef;
                          auVar74._12_4_ = 0x219392ef;
                          auVar66 = vcmpps_avx(auVar66,auVar74,5);
                          auVar66 = vandps_avx(auVar66,auVar61);
                          auVar75._0_4_ = auVar66._0_4_ * (float)local_17e8._0_4_;
                          auVar75._4_4_ = auVar66._4_4_ * (float)local_17e8._4_4_;
                          auVar75._8_4_ = auVar66._8_4_ * fStack_17e0;
                          auVar75._12_4_ = auVar66._12_4_ * fStack_17dc;
                          auVar96 = vminps_avx(auVar75,auVar103);
                          auVar80 = ZEXT1664(auVar96);
                          auVar59._0_4_ = auVar66._0_4_ * (float)local_17f8._0_4_;
                          auVar59._4_4_ = auVar66._4_4_ * (float)local_17f8._4_4_;
                          auVar59._8_4_ = auVar66._8_4_ * fStack_17f0;
                          auVar59._12_4_ = auVar66._12_4_ * fStack_17ec;
                          auVar66 = vminps_avx(auVar59,auVar103);
                          p0.field_0._0_8_ = local_1828._0_8_;
                          p0.field_0._8_8_ = local_1828._8_8_;
                          p0.field_0._16_8_ = local_1838._0_8_;
                          p0.field_0._24_8_ = local_1838._8_8_;
                          p0.field_0.field_0.z.field_0 = (vfloat_impl<4>)(vfloat_impl<4>)local_1848;
                          vpcmpeqd_avx2(ZEXT1632(auVar66),ZEXT1632(auVar66));
                          auVar66 = *(undefined1 (*) [16])(ray + 0x80);
                          auVar61 = vblendvps_avx(auVar66,local_1818,(undefined1  [16])aVar47);
                          *(undefined1 (*) [16])(ray + 0x80) = auVar61;
                          itime.field_0 = aVar47;
                          p1.field_0._0_8_ = &itime;
                          p1.field_0._8_8_ = pGVar5->userPtr;
                          p1.field_0._16_8_ = context->user;
                          p1.field_0._24_8_ = ray;
                          p1.field_0._32_8_ = &p0;
                          p1.field_0._40_4_ = 4;
                          if (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                            auVar80 = ZEXT1664(auVar96);
                            auVar151 = ZEXT1664(auVar149);
                            auVar160 = ZEXT1664(auVar159);
                            in_ZMM14 = ZEXT1664(auVar190);
                            (*pGVar5->occlusionFilterN)((RTCFilterFunctionNArguments *)&p1);
                            auVar196 = ZEXT1664(CONCAT412(0x7f800000,
                                                          CONCAT48(0x7f800000,0x7f8000007f800000)));
                          }
                          if (itime.field_0 == (anon_union_16_2_9473010e_for_vint_impl<4>_1)0x0) {
                            auVar61 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                            auVar61 = auVar61 ^ _DAT_01f7ae20;
                          }
                          else {
                            p_Var7 = context->args->filter;
                            if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                              auVar151 = ZEXT1664(auVar151._0_16_);
                              auVar160 = ZEXT1664(auVar160._0_16_);
                              in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
                              (*p_Var7)((RTCFilterFunctionNArguments *)&p1);
                              auVar196 = ZEXT1664(CONCAT412(0x7f800000,
                                                            CONCAT48(0x7f800000,0x7f8000007f800000))
                                                 );
                            }
                            auVar96 = vpcmpeqd_avx((undefined1  [16])itime.field_0,_DAT_01f7aa10);
                            auVar61 = auVar96 ^ _DAT_01f7ae20;
                            auVar76._8_4_ = 0xff800000;
                            auVar76._0_8_ = 0xff800000ff800000;
                            auVar76._12_4_ = 0xff800000;
                            auVar80 = ZEXT1664(auVar76);
                            auVar96 = vblendvps_avx(auVar76,*(undefined1 (*) [16])
                                                             (p1.field_0._24_8_ + 0x80),auVar96);
                            *(undefined1 (*) [16])(p1.field_0._24_8_ + 0x80) = auVar96;
                          }
                          auVar61 = vpslld_avx(auVar61,0x1f);
                          aVar47 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                                   vpsrad_avx(auVar61,0x1f);
                          auVar66 = vblendvps_avx(auVar66,*(undefined1 (*) [16])pRVar1,auVar61);
                          *(undefined1 (*) [16])pRVar1 = auVar66;
                        }
                        auVar84 = vpandn_avx((undefined1  [16])aVar47,auVar84);
                      }
                      if (((((auVar84 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                            (auVar84 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar84 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           -1 < auVar84[0xf]) || (bVar38 = 2 < uVar36, uVar36 = uVar36 + 1, bVar38))
                      break;
                    }
                    auVar66 = vandps_avx(auVar79,auVar84);
                    auVar79 = auVar79 & auVar84;
                  } while (((((auVar79 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                             (auVar79 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar79 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            auVar79[0xf] < '\0') &&
                          (uVar26 = uVar26 + 1, auVar79 = auVar66, uVar26 < uVar24 - 8));
                  auVar79 = vpcmpeqd_avx(auVar80._0_16_,auVar80._0_16_);
                  aVar62._0_4_ = auVar66._0_4_ ^ auVar79._0_4_;
                  aVar62._4_4_ = auVar66._4_4_ ^ auVar79._4_4_;
                  aVar62._8_4_ = auVar66._8_4_ ^ auVar79._8_4_;
                  aVar62._12_4_ = auVar66._12_4_ ^ auVar79._12_4_;
                }
                terminated.field_0 =
                     (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                     vpor_avx((undefined1  [16])terminated.field_0,(undefined1  [16])aVar62);
                auVar79 = auVar79 & ~(undefined1  [16])terminated.field_0;
                if ((((auVar79 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (auVar79 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar79 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    -1 < auVar79[0xf]) goto LAB_019c5bc6;
                auVar64 = ZEXT1664((undefined1  [16])tray.tfar.field_0);
                auVar78._8_4_ = 0xff800000;
                auVar78._0_8_ = 0xff800000ff800000;
                auVar78._12_4_ = 0xff800000;
                tray.tfar.field_0 =
                     (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar78,
                                   (undefined1  [16])terminated.field_0);
              }
              goto LAB_019c4b68;
            }
            uVar24 = root.ptr & 0xfffffffffffffff0;
            lVar28 = -0x10;
            auVar79 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar79,6);
            auVar64 = ZEXT1664(auVar196._0_16_);
            sVar29 = 8;
            do {
              root.ptr = *(size_t *)(uVar24 + 0x20 + lVar28 * 2);
              auVar84 = auVar64._0_16_;
              if (root.ptr == 8) {
                auVar80 = ZEXT1664(auVar84);
                root.ptr = sVar29;
                break;
              }
              uVar27 = *(undefined4 *)(uVar24 + 0x90 + lVar28);
              auVar61._4_4_ = uVar27;
              auVar61._0_4_ = uVar27;
              auVar61._8_4_ = uVar27;
              auVar61._12_4_ = uVar27;
              uVar27 = *(undefined4 *)(uVar24 + 0x30 + lVar28);
              auVar97._4_4_ = uVar27;
              auVar97._0_4_ = uVar27;
              auVar97._8_4_ = uVar27;
              auVar97._12_4_ = uVar27;
              auVar66 = *(undefined1 (*) [16])(ray + 0x70);
              auVar61 = vfmadd231ps_fma(auVar97,auVar66,auVar61);
              uVar27 = *(undefined4 *)(uVar24 + 0xb0 + lVar28);
              auVar85._4_4_ = uVar27;
              auVar85._0_4_ = uVar27;
              auVar85._8_4_ = uVar27;
              auVar85._12_4_ = uVar27;
              uVar27 = *(undefined4 *)(uVar24 + 0x50 + lVar28);
              auVar111._4_4_ = uVar27;
              auVar111._0_4_ = uVar27;
              auVar111._8_4_ = uVar27;
              auVar111._12_4_ = uVar27;
              auVar96 = vfmadd231ps_fma(auVar111,auVar66,auVar85);
              uVar27 = *(undefined4 *)(uVar24 + 0xd0 + lVar28);
              auVar86._4_4_ = uVar27;
              auVar86._0_4_ = uVar27;
              auVar86._8_4_ = uVar27;
              auVar86._12_4_ = uVar27;
              uVar27 = *(undefined4 *)(uVar24 + 0x70 + lVar28);
              auVar125._4_4_ = uVar27;
              auVar125._0_4_ = uVar27;
              auVar125._8_4_ = uVar27;
              auVar125._12_4_ = uVar27;
              auVar58 = vfmadd231ps_fma(auVar125,auVar66,auVar86);
              uVar27 = *(undefined4 *)(uVar24 + 0xa0 + lVar28);
              auVar87._4_4_ = uVar27;
              auVar87._0_4_ = uVar27;
              auVar87._8_4_ = uVar27;
              auVar87._12_4_ = uVar27;
              uVar27 = *(undefined4 *)(uVar24 + 0x40 + lVar28);
              auVar137._4_4_ = uVar27;
              auVar137._0_4_ = uVar27;
              auVar137._8_4_ = uVar27;
              auVar137._12_4_ = uVar27;
              auVar109 = vfmadd231ps_fma(auVar137,auVar66,auVar87);
              uVar27 = *(undefined4 *)(uVar24 + 0xc0 + lVar28);
              auVar88._4_4_ = uVar27;
              auVar88._0_4_ = uVar27;
              auVar88._8_4_ = uVar27;
              auVar88._12_4_ = uVar27;
              uVar27 = *(undefined4 *)(uVar24 + 0x60 + lVar28);
              auVar143._4_4_ = uVar27;
              auVar143._0_4_ = uVar27;
              auVar143._8_4_ = uVar27;
              auVar143._12_4_ = uVar27;
              auVar110 = vfmadd231ps_fma(auVar143,auVar66,auVar88);
              uVar27 = *(undefined4 *)(uVar24 + 0xe0 + lVar28);
              auVar89._4_4_ = uVar27;
              auVar89._0_4_ = uVar27;
              auVar89._8_4_ = uVar27;
              auVar89._12_4_ = uVar27;
              uVar27 = *(undefined4 *)(uVar24 + 0x80 + lVar28);
              auVar154._4_4_ = uVar27;
              auVar154._0_4_ = uVar27;
              auVar154._8_4_ = uVar27;
              auVar154._12_4_ = uVar27;
              auVar152 = vfmadd231ps_fma(auVar154,auVar66,auVar89);
              auVar12._8_8_ = tray.org.field_0._8_8_;
              auVar12._0_8_ = tray.org.field_0._0_8_;
              auVar13._8_8_ = tray.org.field_0._24_8_;
              auVar13._0_8_ = tray.org.field_0._16_8_;
              auVar14._8_8_ = tray.org.field_0._40_8_;
              auVar14._0_8_ = tray.org.field_0._32_8_;
              auVar61 = vsubps_avx(auVar61,auVar12);
              auVar98._0_4_ = tray.rdir.field_0._0_4_ * auVar61._0_4_;
              auVar98._4_4_ = tray.rdir.field_0._4_4_ * auVar61._4_4_;
              auVar98._8_4_ = tray.rdir.field_0._8_4_ * auVar61._8_4_;
              auVar98._12_4_ = tray.rdir.field_0._12_4_ * auVar61._12_4_;
              auVar61 = vsubps_avx(auVar96,auVar13);
              auVar112._0_4_ = tray.rdir.field_0._16_4_ * auVar61._0_4_;
              auVar112._4_4_ = tray.rdir.field_0._20_4_ * auVar61._4_4_;
              auVar112._8_4_ = tray.rdir.field_0._24_4_ * auVar61._8_4_;
              auVar112._12_4_ = tray.rdir.field_0._28_4_ * auVar61._12_4_;
              auVar61 = vsubps_avx(auVar58,auVar14);
              in_ZMM14 = ZEXT1664((undefined1  [16])tray.rdir.field_0.field_0.z.field_0);
              auVar126._0_4_ = tray.rdir.field_0._32_4_ * auVar61._0_4_;
              auVar126._4_4_ = tray.rdir.field_0._36_4_ * auVar61._4_4_;
              auVar126._8_4_ = tray.rdir.field_0._40_4_ * auVar61._8_4_;
              auVar126._12_4_ = tray.rdir.field_0._44_4_ * auVar61._12_4_;
              auVar61 = vsubps_avx(auVar109,auVar12);
              auVar138._0_4_ = tray.rdir.field_0._0_4_ * auVar61._0_4_;
              auVar138._4_4_ = tray.rdir.field_0._4_4_ * auVar61._4_4_;
              auVar138._8_4_ = tray.rdir.field_0._8_4_ * auVar61._8_4_;
              auVar138._12_4_ = tray.rdir.field_0._12_4_ * auVar61._12_4_;
              auVar61 = vsubps_avx(auVar110,auVar13);
              auVar144._0_4_ = tray.rdir.field_0._16_4_ * auVar61._0_4_;
              auVar144._4_4_ = tray.rdir.field_0._20_4_ * auVar61._4_4_;
              auVar144._8_4_ = tray.rdir.field_0._24_4_ * auVar61._8_4_;
              auVar144._12_4_ = tray.rdir.field_0._28_4_ * auVar61._12_4_;
              auVar151 = ZEXT1664(auVar144);
              auVar61 = vsubps_avx(auVar152,auVar14);
              auVar155._0_4_ = tray.rdir.field_0._32_4_ * auVar61._0_4_;
              auVar155._4_4_ = tray.rdir.field_0._36_4_ * auVar61._4_4_;
              auVar155._8_4_ = tray.rdir.field_0._40_4_ * auVar61._8_4_;
              auVar155._12_4_ = tray.rdir.field_0._44_4_ * auVar61._12_4_;
              auVar160 = ZEXT1664(auVar155);
              auVar61 = vpminsd_avx(auVar98,auVar138);
              auVar96 = vpminsd_avx(auVar112,auVar144);
              auVar61 = vpmaxsd_avx(auVar61,auVar96);
              auVar96 = vpminsd_avx(auVar126,auVar155);
              auVar61 = vpmaxsd_avx(auVar61,auVar96);
              auVar90._0_4_ = auVar61._0_4_ * 0.99999964;
              auVar90._4_4_ = auVar61._4_4_ * 0.99999964;
              auVar90._8_4_ = auVar61._8_4_ * 0.99999964;
              auVar90._12_4_ = auVar61._12_4_ * 0.99999964;
              auVar61 = vpmaxsd_avx(auVar98,auVar138);
              auVar96 = vpmaxsd_avx(auVar112,auVar144);
              auVar96 = vpminsd_avx(auVar61,auVar96);
              auVar61 = vpmaxsd_avx(auVar126,auVar155);
              auVar96 = vpminsd_avx(auVar96,auVar61);
              auVar61 = vpmaxsd_avx(auVar90,(undefined1  [16])tray.tnear.field_0);
              auVar113._0_4_ = auVar96._0_4_ * 1.0000004;
              auVar113._4_4_ = auVar96._4_4_ * 1.0000004;
              auVar113._8_4_ = auVar96._8_4_ * 1.0000004;
              auVar113._12_4_ = auVar96._12_4_ * 1.0000004;
              auVar96 = vpminsd_avx(auVar113,(undefined1  [16])tray.tfar.field_0);
              if ((uVar22 & 7) == 6) {
                auVar61 = vcmpps_avx(auVar61,auVar96,2);
                uVar27 = *(undefined4 *)(uVar24 + 0xf0 + lVar28);
                auVar114._4_4_ = uVar27;
                auVar114._0_4_ = uVar27;
                auVar114._8_4_ = uVar27;
                auVar114._12_4_ = uVar27;
                auVar96 = vcmpps_avx(auVar114,auVar66,2);
                uVar27 = *(undefined4 *)(uVar24 + 0x100 + lVar28);
                auVar127._4_4_ = uVar27;
                auVar127._0_4_ = uVar27;
                auVar127._8_4_ = uVar27;
                auVar127._12_4_ = uVar27;
                auVar66 = vcmpps_avx(auVar66,auVar127,1);
                auVar66 = vandps_avx(auVar96,auVar66);
                auVar66 = vandps_avx(auVar66,auVar61);
              }
              else {
                auVar66 = vcmpps_avx(auVar61,auVar96,2);
              }
              auVar66 = vandps_avx(auVar66,auVar79);
              auVar66 = vpslld_avx(auVar66,0x1f);
              if ((((auVar66 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar66 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar66 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar66[0xf]) {
                auVar80 = ZEXT1664(auVar84);
                root.ptr = sVar29;
              }
              else {
                auVar66 = vblendvps_avx(auVar196._0_16_,auVar90,auVar66);
                auVar80 = ZEXT1664(auVar66);
                if (sVar29 != 8) {
                  pNVar35->ptr = sVar29;
                  pNVar35 = pNVar35 + 1;
                  *(undefined1 (*) [16])paVar37->v = auVar84;
                  paVar37 = paVar37 + 1;
                }
              }
              auVar64 = ZEXT1664(auVar80._0_16_);
              lVar28 = lVar28 + 4;
              sVar29 = root.ptr;
            } while (lVar28 != 0);
            iVar23 = 4;
            if (root.ptr == 8) goto LAB_019c4e04;
            auVar79 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,
                                 (undefined1  [16])auVar80._0_16_,6);
            uVar27 = vmovmskps_avx(auVar79);
          } while ((byte)uVar32 < (byte)POPCOUNT(uVar27));
          pNVar35->ptr = root.ptr;
          pNVar35 = pNVar35 + 1;
          *paVar37 = auVar80._0_16_;
          paVar37 = paVar37 + 1;
        }
        else {
          do {
            sVar29 = 0;
            for (uVar26 = uVar24; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000) {
              sVar29 = sVar29 + 1;
            }
            auVar64 = ZEXT1664(auVar64._0_16_);
            auVar151 = ZEXT1664(auVar151._0_16_);
            auVar160 = ZEXT1664(auVar160._0_16_);
            in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
            bVar38 = occluded1(This,bvh,root,sVar29,&pre,ray,&tray,context);
            if (bVar38) {
              terminated.field_0.i[sVar29] = -1;
            }
            uVar24 = uVar24 - 1 & uVar24;
          } while (uVar24 != 0);
          auVar79 = _DAT_01f7ae20 & ~(undefined1  [16])terminated.field_0;
          if ((((auVar79 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (auVar79 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar79 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar79[0xf]) {
            iVar23 = 3;
          }
          else {
            auVar64 = ZEXT1664((undefined1  [16])tray.tfar.field_0);
            auVar79._8_4_ = 0xff800000;
            auVar79._0_8_ = 0xff800000ff800000;
            auVar79._12_4_ = 0xff800000;
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar79,
                               (undefined1  [16])terminated.field_0);
            iVar23 = 2;
          }
          auVar196 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          auVar80 = ZEXT1664((undefined1  [16])vVar3.field_0);
          if (uVar32 < uVar22) goto LAB_019c4ba8;
        }
LAB_019c4e04:
      } while ((iVar23 == 4) || (iVar23 == 2));
LAB_019c5bc6:
      auVar9 = vandps_avx(auVar9,(undefined1  [16])terminated.field_0);
      auVar63._8_4_ = 0xff800000;
      auVar63._0_8_ = 0xff800000ff800000;
      auVar63._12_4_ = 0xff800000;
      auVar9 = vmaskmovps_avx(auVar9,auVar63);
      *(undefined1 (*) [16])pRVar1 = auVar9;
      return;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }